

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Check_Browser.cxx
# Opt level: O0

void __thiscall Fl_Check_Browser::item_select(Fl_Check_Browser *this,void *v,int state)

{
  cb_item *i;
  int state_local;
  void *v_local;
  Fl_Check_Browser *this_local;
  
  if (state != 0) {
    if (*(char *)((long)v + 0x10) == '\0') {
      *(undefined1 *)((long)v + 0x10) = 1;
      this->nchecked_ = this->nchecked_ + 1;
    }
    else {
      *(undefined1 *)((long)v + 0x10) = 0;
      this->nchecked_ = this->nchecked_ + -1;
    }
  }
  return;
}

Assistant:

void Fl_Check_Browser::item_select(void *v, int state) {
	cb_item *i = (cb_item *)v;

	if (state) {
		if (i->checked) {
			i->checked = 0;
			nchecked_--;
		} else {
			i->checked = 1;
			nchecked_++;
		}
	}
}